

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ar.c
# Opt level: O3

int archive_write_ar_finish_entry(archive_write *a)

{
  long lVar1;
  int iVar2;
  
  if (*a->format_data == 0) {
    lVar1 = *(long *)((long)a->format_data + 8);
    if (lVar1 == 0) {
      return 0;
    }
    if (lVar1 == 1) {
      iVar2 = __archive_write_output(a,"\n",1);
      return iVar2;
    }
    archive_set_error(&a->archive,-1,"Padding wrong size: %ju should be 1 or 0");
  }
  else {
    archive_set_error(&a->archive,-1,"Entry remaining bytes larger than 0");
  }
  return -0x14;
}

Assistant:

static int
archive_write_ar_finish_entry(struct archive_write *a)
{
	struct ar_w *ar;
	int ret;

	ar = (struct ar_w *)a->format_data;

	if (ar->entry_bytes_remaining != 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Entry remaining bytes larger than 0");
		return (ARCHIVE_WARN);
	}

	if (ar->entry_padding == 0) {
		return (ARCHIVE_OK);
	}

	if (ar->entry_padding != 1) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Padding wrong size: %ju should be 1 or 0",
		    (uintmax_t)ar->entry_padding);
		return (ARCHIVE_WARN);
	}

	ret = __archive_write_output(a, "\n", 1);
	return (ret);
}